

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

ssize_t __thiscall Socket::recv(Socket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ulong uVar1;
  int *piVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  
  uVar1 = ::recv(this->s,(void *)CONCAT44(in_register_00000034,__fd),(long)(int)__buf,0);
  if (uVar1 != 0) {
    if (uVar1 == 0xffffffffffffffff) {
      piVar2 = __errno_location();
      uVar1 = 0xffffffffffffffff;
      if (*piVar2 != 0xb) {
        return -1;
      }
    }
    else {
      while( true ) {
        if (__n <= uVar1) {
          return uVar1;
        }
        sVar3 = ::recv(this->s,(void *)((long)CONCAT44(in_register_00000034,__fd) + uVar1),
                       (long)((int)__buf - (int)uVar1),0);
        if (sVar3 == 0) {
          return 0;
        }
        if (sVar3 == -1) break;
        uVar1 = uVar1 + sVar3;
      }
      piVar2 = __errno_location();
      if (*piVar2 != 0xb) {
        return -1;
      }
    }
    *piVar2 = 0;
  }
  return uVar1;
}

Assistant:

ssize Socket::recv(byte* data, usize maxSize, usize minSize)
{
  ssize r = ::recv(s, (char*)data, (int)maxSize, 0);
  switch(r)
  {
  case SOCKET_ERROR:
    if(ERRNO == EWOULDBLOCK 
#ifndef _WIN32
      || ERRNO == EAGAIN
#endif
      )
    {
      SET_ERRNO(0);
    }
    return -1;
  case 0:
    return 0;
  default:
    break;
  }
  if((usize)r >= minSize)
    return r;
  usize received = (usize)r;
  for(;;)
  {
    r = ::recv(s, (char*)data + received, (int)(maxSize - received), 0);
    switch(r)
    {
    case SOCKET_ERROR:
      if(ERRNO == EWOULDBLOCK 
  #ifndef _WIN32
        || ERRNO == EAGAIN
  #endif
        )
      {
        SET_ERRNO(0);
        return received;
      }
      return -1;
    case 0:
      return 0;
    default:
      break;
    }
    received += r;
    if(received >= minSize)
      return received;
  }
}